

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall Catch::XmlWriter::writeBlankLine(XmlWriter *this)

{
  ostream *poVar1;
  XmlWriter *this_local;
  
  ensureTagClosed(this);
  poVar1 = stream(this);
  std::operator<<(poVar1,"\n");
  return this;
}

Assistant:

XmlWriter& writeBlankLine() {
            ensureTagClosed();
            stream() << "\n";
            return *this;
        }